

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void freestack(lua_State *L)

{
  lua_State *L_local;
  
  if ((L->stack).p != (StkId)0x0) {
    L->ci = &L->base_ci;
    freeCI(L);
    luaM_free_(L,(L->stack).p,
               (long)((int)((long)(L->stack_last).p - (L->stack).offset >> 4) + 5) << 4);
  }
  return;
}

Assistant:

static void freestack (lua_State *L) {
  if (L->stack.p == NULL)
    return;  /* stack not completely built yet */
  L->ci = &L->base_ci;  /* free the entire 'ci' list */
  freeCI(L);
  lua_assert(L->nci == 0);
  luaM_freearray(L, L->stack.p, stacksize(L) + EXTRA_STACK);  /* free stack */
}